

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

int nsync::nsync_mu_rtrylock(nsync_mu *mu)

{
  int iVar1;
  uint o;
  undefined1 local_19;
  undefined4 local_14;
  uint32_t old_word;
  int result;
  nsync_mu *mu_local;
  
  iVar1 = atm_cas_acq_u32_(&mu->word,0,0x100);
  if (iVar1 == 0) {
    o = std::atomic_load_explicit<unsigned_int>(&mu->word,memory_order_relaxed);
    local_19 = false;
    if ((o & 0x61) == 0) {
      iVar1 = atm_cas_acq_u32_(&mu->word,o,o + 0x100);
      local_19 = iVar1 != 0;
    }
    local_14 = (uint)local_19;
  }
  else {
    local_14 = 1;
  }
  return local_14;
}

Assistant:

int nsync_mu_rtrylock (nsync_mu *mu) {
	int result;
	IGNORE_RACES_START ();
	if (ATM_CAS_ACQ (&mu->word, 0, MU_RADD_TO_ACQUIRE)) { /* acquire CAS */
		result = 1;
	} else {
		uint32_t old_word = ATM_LOAD (&mu->word);
		result = ((old_word&MU_RZERO_TO_ACQUIRE) == 0 &&
			  ATM_CAS_ACQ (&mu->word, old_word,
				       (old_word+MU_RADD_TO_ACQUIRE) & ~MU_RCLEAR_ON_ACQUIRE));
	}
	IGNORE_RACES_END ();
	RWLOCK_TRYACQUIRE (result, mu, 0);
	return (result);
}